

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O2

bool __thiscall
cmQtAutoMocUic::JobT::RunProcess
          (JobT *this,GenT genType,ProcessResultT *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *infoMessage)

{
  bool bVar1;
  void *pvVar2;
  string msg;
  string local_40;
  
  pvVar2 = ((this->super_JobT).Pool_)->UserData_;
  if (*(int *)((long)pvVar2 + 0x98) != 0) {
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    msg._M_string_length = 0;
    msg.field_2._M_local_buf[0] = '\0';
    if ((infoMessage != (string *)0x0) && (infoMessage->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&msg);
      if (msg._M_dataplus._M_p[msg._M_string_length - 1] != '\n') {
        std::__cxx11::string::push_back((char)&msg);
      }
    }
    cmQtAutoGen::QuotedCommand(&local_40,command);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::push_back((char)&msg);
    cmQtAutoGenerator::Logger::Info
              ((Logger *)((long)((this->super_JobT).Pool_)->UserData_ + 0x70),genType,&msg);
    std::__cxx11::string::~string((string *)&msg);
    pvVar2 = ((this->super_JobT).Pool_)->UserData_;
  }
  bVar1 = cmWorkerPool::JobT::RunProcess
                    (&this->super_JobT,result,command,(string *)((long)pvVar2 + 0x128));
  return bVar1;
}

Assistant:

bool cmQtAutoMocUic::JobT::RunProcess(GenT genType,
                                      cmWorkerPool::ProcessResultT& result,
                                      std::vector<std::string> const& command,
                                      std::string* infoMessage)
{
  // Log command
  if (Log().Verbose()) {
    std::string msg;
    if ((infoMessage != nullptr) && !infoMessage->empty()) {
      msg = *infoMessage;
      if (msg.back() != '\n') {
        msg += '\n';
      }
    }
    msg += QuotedCommand(command);
    msg += '\n';
    Log().Info(genType, msg);
  }
  return cmWorkerPool::JobT::RunProcess(result, command,
                                        BaseConst().AutogenBuildDir);
}